

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void RegisterNodeRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  CRPCTable *in_stack_fffffffffffffe68;
  CRPCCommand *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string *category;
  CRPCCommand *in_stack_fffffffffffffe88;
  CRPCCommand *this;
  allocator<char> *in_stack_fffffffffffffe98;
  allocator<char> *__a;
  char *in_stack_fffffffffffffea0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CRPCCommand *local_140;
  allocator<char> local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d [2];
  allocator<char> local_10b;
  allocator<char> local_10a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_109 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterNodeRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      this_00 = local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (RpcMethodFnType)in_stack_fffffffffffffe78);
      __s = &local_10a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__s,in_stack_fffffffffffffe98);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (RpcMethodFnType)in_stack_fffffffffffffe78);
      __a = &local_10b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (RpcMethodFnType)in_stack_fffffffffffffe78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (RpcMethodFnType)in_stack_fffffffffffffe78);
      this = (CRPCCommand *)local_10d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (this,in_stack_fffffffffffffe80,(RpcMethodFnType)in_stack_fffffffffffffe78);
      category = (string *)&local_10e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe78 = (CRPCCommand *)&local_10f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffe78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator(&local_110);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)&local_10f);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)&local_10e);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)local_10d);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)(local_10d + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator(&local_10b);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator(&local_10a);
      std::__cxx11::string::~string(in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)local_109);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    }
  }
  for (local_140 = RegisterNodeRPCCommands::commands;
      local_140 != (CRPCCommand *)&RegisterNodeRPCCommands(CRPCTable&)::commands;
      local_140 = local_140 + 1) {
    CRPCTable::appendCommand
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterNodeRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"control", &getmemoryinfo},
        {"control", &logging},
        {"util", &getindexinfo},
        {"hidden", &setmocktime},
        {"hidden", &mockscheduler},
        {"hidden", &echo},
        {"hidden", &echojson},
        {"hidden", &echoipc},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}